

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O2

bool __thiscall hanabi_learning_env::HanabiState::HintingIsLegal(HanabiState *this,HanabiMove move)

{
  if (move.target_offset_ < '\x01' || this->information_tokens_ < 1) {
    return false;
  }
  return (int)(move._4_4_ >> 8 & 0x7f) < this->parent_game_->num_players_;
}

Assistant:

bool HanabiState::HintingIsLegal(HanabiMove move) const {
  if (InformationTokens() <= 0) {
    return false;
  }
  if (move.TargetOffset() < 1 ||
      move.TargetOffset() >= ParentGame()->NumPlayers()) {
    return false;
  }
  return true;
}